

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

void server_poll_cb(uv_poll_t *handle,int status,int events)

{
  long ******pppppplVar1;
  int iVar2;
  int iVar3;
  connection_context_t *pcVar4;
  long ******pppppplVar5;
  undefined8 uVar6;
  ssize_t sVar7;
  int *piVar8;
  uint extraout_EDX;
  uint uVar9;
  code *__n;
  char *pcVar10;
  uint uVar11;
  undefined4 uVar12;
  long *plVar13;
  code **ppcVar14;
  long *****ppppplVar15;
  long ******pppppplVar16;
  long ******pppppplVar17;
  int64_t eval_b;
  int64_t eval_a;
  socklen_t addr_len;
  sockaddr_in addr;
  code *pcStack_d0;
  undefined8 uStack_c8;
  long lStack_c0;
  long *****ppppplStack_b8;
  code *pcStack_b0;
  long *****ppppplStack_a8;
  long *****ppppplStack_a0;
  long *****ppppplStack_98;
  long *****ppppplStack_90;
  undefined8 uStack_60;
  long ****pppplStack_58;
  long *****ppppplStack_50;
  undefined8 local_30;
  long local_28;
  socklen_t local_1c;
  sockaddr local_18;
  
  __n = (code *)handle->data;
  local_1c = 0x10;
  iVar2 = accept(*(int *)((long)__n + 0x80),&local_18,&local_1c);
  local_28 = (long)iVar2;
  local_30 = 0;
  if (local_28 < 0) {
    server_poll_cb_cold_2();
  }
  else {
    pcVar4 = create_connection_context(iVar2,1);
    pcVar4->events = 7;
    iVar2 = uv_poll_start(pcVar4,7,connection_poll_cb);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 == 0) {
      iVar2 = *(int *)((long)__n + 0x84) + 1;
      *(int *)((long)__n + 0x84) = iVar2;
      if (iVar2 == 5) {
        close_socket(*(uv_os_sock_t *)((long)__n + 0x80));
        uv_close(__n,server_close_cb);
      }
      return;
    }
  }
  plVar13 = &local_28;
  uVar12 = SUB84(&local_30,0);
  server_poll_cb_cold_1();
  iVar2 = (int)&uStack_60;
  ppppplStack_50 = (long *****)__n;
  pppppplVar5 = (long ******)malloc(0x130);
  if (pppppplVar5 == (long ******)0x0) {
    create_connection_context_cold_3();
LAB_001b6216:
    create_connection_context_cold_1();
  }
  else {
    *(int *)(pppppplVar5 + 0x1f) = (int)plVar13;
    *(undefined4 *)(pppppplVar5 + 0x22) = uVar12;
    pppppplVar5[0x20] = (long *****)0x0;
    pppppplVar5[0x21] = (long *****)0x0;
    *(undefined8 *)((long)pppppplVar5 + 0x114) = 0;
    *(undefined8 *)((long)pppppplVar5 + 0x11c) = 0;
    *(undefined8 *)((long)pppppplVar5 + 0x124) = 0;
    uVar6 = uv_default_loop();
    iVar3 = uv_poll_init(uVar6,pppppplVar5,(ulong)plVar13 & 0xffffffff);
    *(int *)((long)pppppplVar5 + 0x114) = *(int *)((long)pppppplVar5 + 0x114) + 1;
    *pppppplVar5 = (long *****)pppppplVar5;
    pppplStack_58 = (long ****)(long)iVar3;
    uStack_60 = 0;
    __n = (code *)pppppplVar5;
    if ((long *****)pppplStack_58 != (long *****)0x0) goto LAB_001b6216;
    uVar6 = uv_default_loop();
    iVar3 = uv_timer_init(uVar6,pppppplVar5 + 0x10);
    *(int *)((long)pppppplVar5 + 0x114) = *(int *)((long)pppppplVar5 + 0x114) + 1;
    pppppplVar5[0x10] = (long *****)pppppplVar5;
    pppplStack_58 = (long ****)(long)iVar3;
    uStack_60 = 0;
    if ((long *****)pppplStack_58 == (long *****)0x0) {
      return;
    }
  }
  pppppplVar5 = (long ******)&pppplStack_58;
  create_connection_context_cold_2();
  pppppplVar1 = (long ******)*pppppplVar5;
  ppppplStack_a0 = (long *****)(long)iVar2;
  ppppplStack_a8 = (long *****)0x0;
  ppppplStack_90 = (long *****)__n;
  if ((long ******)ppppplStack_a0 == (long ******)0x0) {
    uVar11 = *(uint *)((long)pppppplVar1 + 0x124);
    if ((uVar11 & extraout_EDX) == 0) goto LAB_001b68d6;
    if ((~uVar11 & extraout_EDX) == 0) {
      pppppplVar16 = pppppplVar5;
      if ((extraout_EDX & 1) != 0) goto LAB_001b63cb;
switchD_001b640c_caseD_4:
      if ((extraout_EDX & 2) != 0) {
        if ((pppppplVar1[0x21] < (long *****)0x10000) &&
           ((test_mode != '\x01' || (*(int *)(pppppplVar1 + 0x22) == 0)))) {
          pcStack_b0 = (code *)0x1b64ac;
          iVar2 = rand();
          pcVar10 = (char *)__n;
          switch(iVar2 % 7) {
          case 0:
          case 1:
            pppppplVar17 = (long ******)0x67;
            if ((long ******)(0x10000 - (long)pppppplVar1[0x21]) < (long ******)0x67) {
              pppppplVar17 = (long ******)(0x10000 - (long)pppppplVar1[0x21]);
            }
            ppppplStack_a8 = (long *****)0x0;
            ppppplStack_a0 = (long *****)pppppplVar17;
            ppppplStack_98 = (long *****)pppppplVar16;
            if ((long)pppppplVar17 < 1) goto LAB_001b6919;
            do {
              pppppplVar5 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
              pcStack_b0 = (code *)0x1b6540;
              pcVar10 = (char *)send(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_2,
                                     (size_t)pppppplVar17,0);
              uVar9 = (uint)pcVar10;
              if (uVar9 != 0xffffffff) break;
              pcStack_b0 = (code *)0x1b654d;
              piVar8 = __errno_location();
            } while (*piVar8 == 4);
            pppppplVar16 = (long ******)ppppplStack_98;
            if ((int)uVar9 < 0) {
              pcStack_b0 = (code *)0x1b6845;
              piVar8 = __errno_location();
              __n = (code *)pcVar10;
              if ((*piVar8 != 0xb) && (*piVar8 != 0x73)) {
                pcStack_b0 = (code *)0x1b6856;
                connection_poll_cb_cold_15();
                goto LAB_001b6856;
              }
LAB_001b6870:
              spurious_writable_wakeups = spurious_writable_wakeups + 1;
            }
            else {
              __n = (code *)(ulong)(uVar9 & 0x7fffffff);
              ppppplStack_a8 = (long *****)0x0;
              ppppplStack_a0 = (long *****)__n;
              if ((long ******)__n == (long ******)0x0) goto LAB_001b6933;
              pppppplVar1[0x21] = (long *****)((long)pppppplVar1[0x21] + (long)__n);
              valid_writable_wakeups = valid_writable_wakeups + 1;
            }
            break;
          case 2:
          case 3:
            pppppplVar17 = (long ******)(0x10000 - (long)pppppplVar1[0x21]);
            if ((long ******)0x4d1 < pppppplVar17) {
              pppppplVar17 = (long ******)0x4d2;
            }
            ppppplStack_a8 = (long *****)0x0;
            ppppplStack_a0 = (long *****)pppppplVar17;
            ppppplStack_98 = (long *****)pppppplVar16;
            if ((long)pppppplVar17 < 1) goto LAB_001b6926;
            pcVar10 = connection_poll_cb::buffer_3;
            do {
              pppppplVar5 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
              pcStack_b0 = (code *)0x1b66bb;
              sVar7 = send(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_3,
                           (size_t)pppppplVar17,0);
              uVar9 = (uint)sVar7;
              if (uVar9 != 0xffffffff) break;
              pcStack_b0 = (code *)0x1b66c9;
              piVar8 = __errno_location();
            } while (*piVar8 == 4);
            if ((int)uVar9 < 0) {
LAB_001b6856:
              pcStack_b0 = (code *)0x1b685b;
              piVar8 = __errno_location();
              __n = (code *)pcVar10;
              pppppplVar16 = (long ******)ppppplStack_98;
              if ((*piVar8 == 0xb) || (*piVar8 == 0x73)) goto LAB_001b6870;
              goto LAB_001b6952;
            }
            ppppplStack_a0 = (long *****)(ulong)(uVar9 & 0x7fffffff);
            ppppplStack_a8 = (long *****)0x0;
            __n = (code *)pcVar10;
            if ((long ******)ppppplStack_a0 == (long ******)0x0) goto LAB_001b6940;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            ppppplVar15 = (long *****)((long)ppppplStack_a0 + (long)pppppplVar1[0x21]);
            pppppplVar1[0x21] = ppppplVar15;
            while (pppppplVar16 = (long ******)ppppplStack_98, ppppplVar15 < (long *****)0x10000) {
              __n = (code *)(0x10000 - (long)ppppplVar15);
              if (ppppplVar15 < (long *****)0xfb2f) {
                __n = (code *)0x4d2;
              }
              ppppplStack_a8 = (long *****)0x0;
              ppppplStack_a0 = (long *****)__n;
              if ((long)__n < 1) goto LAB_001b68fa;
              do {
                pcStack_b0 = (code *)0x1b676f;
                sVar7 = send(*(int *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_3,(size_t)__n,0
                            );
                uVar9 = (uint)sVar7;
                if (uVar9 != 0xffffffff) break;
                pcStack_b0 = (code *)0x1b677d;
                piVar8 = __errno_location();
              } while (*piVar8 == 4);
              if (uVar9 == 0) {
LAB_001b68c4:
                pcStack_b0 = (code *)0x1b68c9;
                connection_poll_cb_cold_10();
                goto LAB_001b68c9;
              }
              if ((int)uVar9 < 0) {
                pcStack_b0 = (code *)0x1b68a6;
                piVar8 = __errno_location();
                pppppplVar16 = (long ******)ppppplStack_98;
                if ((*piVar8 != 0xb) && (*piVar8 != 0x73)) {
                  pcStack_b0 = (code *)0x1b68c4;
                  connection_poll_cb_cold_11();
                  goto LAB_001b68c4;
                }
                break;
              }
              ppppplVar15 = (long *****)((ulong)(uVar9 & 0x7fffffff) + (long)pppppplVar1[0x21]);
              pppppplVar1[0x21] = ppppplVar15;
            }
            break;
          case 4:
            break;
          case 5:
            uVar11 = uVar11 & 0xfffffffd;
            __n = (code *)(pppppplVar1 + 0x10);
            pcStack_b0 = (code *)0x1b67f8;
            iVar2 = uv_is_active(__n);
            if (iVar2 == 0) {
              *(undefined4 *)(pppppplVar1 + 0x25) = 2;
              pcStack_b0 = (code *)0x1b689c;
              uv_timer_start(__n,delay_timer_cb,100,0);
            }
            else {
              *(byte *)(pppppplVar1 + 0x25) = (byte)*(code *)(pppppplVar1 + 0x25) | 2;
            }
            break;
          case 6:
            __n = connection_poll_cb;
            pcStack_b0 = (code *)0x1b6820;
            uv_poll_start(pppppplVar1,1,connection_poll_cb);
            pcStack_b0 = (code *)0x1b6830;
            uv_poll_start(pppppplVar1,2,connection_poll_cb);
            *(undefined4 *)((long)pppppplVar1 + 0x124) = 2;
            break;
          default:
            goto switchD_001b64e8_default;
          }
        }
        else {
          pcStack_b0 = (code *)0x1b62cb;
          iVar2 = shutdown(*(int *)(pppppplVar1 + 0x1f),1);
          ppppplStack_a0 = (long *****)(long)iVar2;
          ppppplStack_a8 = (long *****)0x0;
          if ((long ******)ppppplStack_a0 != (long ******)0x0) goto LAB_001b68ed;
          *(undefined4 *)((long)pppppplVar1 + 0x11c) = 1;
          uVar11 = uVar11 & 0xfffffffd;
          ppppplStack_a0 = (long *****)(long ******)0x0;
        }
      }
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(pppppplVar1 + 0x24) = 1;
        disconnects = disconnects + 1;
        uVar11 = uVar11 & 0xfffffffb;
      }
      if (((*(int *)(pppppplVar1 + 0x23) == 0) || (*(int *)((long)pppppplVar1 + 0x11c) == 0)) ||
         (*(int *)(pppppplVar1 + 0x24) == 0)) {
        if (uVar11 != *(uint *)((long)pppppplVar1 + 0x124)) {
          *(uint *)((long)pppppplVar1 + 0x124) = uVar11;
          pcStack_b0 = (code *)0x1b638a;
          uv_poll_start(pppppplVar16,uVar11,connection_poll_cb);
        }
      }
      else {
        pcStack_b0 = (code *)0x1b633b;
        close_socket(*(uv_os_sock_t *)(pppppplVar1 + 0x1f));
        __n = connection_close_cb;
        pcStack_b0 = (code *)0x1b634d;
        uv_close(pppppplVar1,connection_close_cb);
        pcStack_b0 = (code *)0x1b635c;
        uv_close(pppppplVar1 + 0x10,connection_close_cb);
        *(undefined4 *)((long)pppppplVar1 + 0x124) = 0;
      }
      if (*(int *)((long)pppppplVar1 + 0x124) == 0) {
        pcStack_b0 = (code *)0x1b647a;
        iVar2 = uv_is_active(pppppplVar16);
        ppppplStack_a0 = (long *****)(long)iVar2;
        ppppplStack_a8 = (long *****)0x0;
        if ((long ******)ppppplStack_a0 == (long ******)0x0) {
          return;
        }
        goto LAB_001b68e0;
      }
      ppppplStack_a0 = (long *****)0x1;
      pcStack_b0 = (code *)0x1b63a9;
      iVar2 = uv_is_active(pppppplVar16);
      ppppplStack_a8 = (long *****)(long)iVar2;
      if (ppppplStack_a0 == ppppplStack_a8) {
        return;
      }
      pppppplVar5 = &ppppplStack_a0;
      pcStack_b0 = (code *)0x1b63cb;
      connection_poll_cb_cold_17();
LAB_001b63cb:
      pcStack_b0 = (code *)0x1b63d0;
      iVar2 = rand();
      switch(iVar2 % 7) {
      case 0:
      case 1:
        do {
          pppppplVar5 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
          pcStack_b0 = (code *)0x1b642b;
          sVar7 = recv(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer,0x4a,0);
          iVar2 = (int)sVar7;
          if (iVar2 != -1) break;
          pcStack_b0 = (code *)0x1b6439;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        ppppplStack_a0 = (long *****)(long)iVar2;
        ppppplStack_a8 = (long *****)0x0;
        __n = (code *)connection_poll_cb::buffer;
        if ((long)ppppplStack_a0 < 0) goto LAB_001b6907;
        if (iVar2 < 1) goto LAB_001b65f5;
        pppppplVar1[0x20] = (long *****)((long)pppppplVar1[0x20] + (long)ppppplStack_a0);
        goto switchD_001b640c_caseD_4;
      case 2:
      case 3:
LAB_001b659a:
        pppppplVar5 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
        pcStack_b0 = (code *)0x1b65b0;
        __n = (code *)recv(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_1,0x3a3,0);
        uVar9 = (uint)__n;
        if (uVar9 == 0xffffffff) goto code_r0x001b65b8;
        goto LAB_001b65c2;
      case 4:
        goto switchD_001b640c_caseD_4;
      case 5:
        uVar11 = uVar11 & 0xfffffffe;
        __n = (code *)(pppppplVar1 + 0x10);
        pcStack_b0 = (code *)0x1b661a;
        pppppplVar5 = (long ******)__n;
        iVar2 = uv_is_active();
        if (iVar2 == 0) {
          *(undefined4 *)(pppppplVar1 + 0x25) = 1;
          pcStack_b0 = (code *)0x1b67e1;
          pppppplVar5 = (long ******)__n;
          uv_timer_start(__n,delay_timer_cb,10,0);
        }
        else {
          *(byte *)(pppppplVar1 + 0x25) = (byte)*(code *)(pppppplVar1 + 0x25) | 1;
        }
        goto switchD_001b640c_caseD_4;
      case 6:
        __n = connection_poll_cb;
        pcStack_b0 = (code *)0x1b6646;
        uv_poll_start(pppppplVar1,2,connection_poll_cb);
        pcStack_b0 = (code *)0x1b6656;
        pppppplVar5 = pppppplVar1;
        uv_poll_start(pppppplVar1,1,connection_poll_cb);
        *(undefined4 *)((long)pppppplVar1 + 0x124) = 1;
        goto switchD_001b640c_caseD_4;
      default:
        goto switchD_001b640c_default;
      }
    }
  }
  else {
LAB_001b68c9:
    pcStack_b0 = (code *)0x1b68d6;
    connection_poll_cb_cold_1();
LAB_001b68d6:
    pcStack_b0 = (code *)0x1b68db;
    connection_poll_cb_cold_19();
  }
  pcStack_b0 = (code *)0x1b68e0;
  connection_poll_cb_cold_2();
LAB_001b68e0:
  pcStack_b0 = (code *)0x1b68ed;
  connection_poll_cb_cold_18();
LAB_001b68ed:
  pcStack_b0 = (code *)0x1b68fa;
  connection_poll_cb_cold_6();
LAB_001b68fa:
  pcStack_b0 = (code *)0x1b6907;
  connection_poll_cb_cold_9();
LAB_001b6907:
  pcStack_b0 = (code *)0x1b6914;
  connection_poll_cb_cold_4();
switchD_001b640c_default:
  pcStack_b0 = (code *)0x1b6919;
  connection_poll_cb_cold_5();
LAB_001b6919:
  pcStack_b0 = (code *)0x1b6926;
  connection_poll_cb_cold_13();
LAB_001b6926:
  pcStack_b0 = (code *)0x1b6933;
  connection_poll_cb_cold_7();
LAB_001b6933:
  pcStack_b0 = (code *)0x1b6940;
  connection_poll_cb_cold_14();
LAB_001b6940:
  pppppplVar5 = &ppppplStack_a0;
  pcStack_b0 = (code *)0x1b694d;
  connection_poll_cb_cold_8();
  pcVar10 = (char *)__n;
switchD_001b64e8_default:
  pcStack_b0 = (code *)0x1b6952;
  connection_poll_cb_cold_16();
LAB_001b6952:
  pcStack_b0 = close_socket;
  connection_poll_cb_cold_12();
  ppppplStack_b8 = (long *****)0x1b695d;
  iVar2 = close((int)pppppplVar5);
  if (iVar2 == 0) {
    return;
  }
  ppppplStack_b8 = (long *****)0x1b6966;
  piVar8 = __errno_location();
  if (*piVar8 == 0x68) {
    return;
  }
  ppppplStack_b8 = (long *****)delay_timer_cb;
  close_socket_cold_1();
  ppppplVar15 = *pppppplVar5;
  pcStack_d0 = (code *)0x1b697f;
  ppppplStack_b8 = (long *****)pcVar10;
  iVar2 = uv_is_active();
  lStack_c0 = (long)iVar2;
  uStack_c8 = 0;
  if (lStack_c0 == 0) {
    if (*(uint *)(ppppplVar15 + 0x25) == 0) goto LAB_001b69f5;
    uVar11 = *(uint *)(ppppplVar15 + 0x25) | *(uint *)((long)ppppplVar15 + 0x124);
    *(uint *)((long)ppppplVar15 + 0x124) = uVar11;
    *(undefined4 *)(ppppplVar15 + 0x25) = 0;
    pcStack_d0 = (code *)0x1b69c8;
    iVar2 = uv_poll_start(ppppplVar15,uVar11,connection_poll_cb);
    lStack_c0 = (long)iVar2;
    uStack_c8 = 0;
    if (lStack_c0 == 0) {
      return;
    }
  }
  else {
    pcStack_d0 = (code *)0x1b69f5;
    delay_timer_cb_cold_1();
LAB_001b69f5:
    pcStack_d0 = (code *)0x1b69fa;
    delay_timer_cb_cold_3();
  }
  plVar13 = &lStack_c0;
  pcStack_d0 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar14 = (code **)*plVar13;
  piVar8 = (int *)((long)ppcVar14 + 0x114);
  *piVar8 = *piVar8 + -1;
  if (*piVar8 != 0) {
    return;
  }
  if ((test_mode == '\x01') && (*(int *)(ppcVar14 + 0x22) == 0)) {
    pcStack_d0 = ppcVar14[0x20];
    if (pcStack_d0 != (code *)0x0) {
      connection_close_cb_cold_2();
LAB_001b6af8:
      connection_close_cb_cold_1();
      goto LAB_001b6b07;
    }
  }
  else {
    pcStack_d0 = ppcVar14[0x20];
    if (pcStack_d0 != (code *)0x10000) goto LAB_001b6af8;
  }
  if ((test_mode != '\0') && (*(int *)(ppcVar14 + 0x22) != 0)) {
    pcStack_d0 = ppcVar14[0x21];
    if (pcStack_d0 == (code *)0x0) goto LAB_001b6ab5;
    ppcVar14 = &pcStack_d0;
    connection_close_cb_cold_3();
  }
  pcStack_d0 = ppcVar14[0x21];
  if (pcStack_d0 != (code *)0x10000) {
LAB_001b6b07:
    ppcVar14 = &pcStack_d0;
    connection_close_cb_cold_4();
    free(*ppcVar14);
    return;
  }
LAB_001b6ab5:
  closed_connections = closed_connections + 1;
  free(ppcVar14);
  return;
code_r0x001b65b8:
  pcStack_b0 = (code *)0x1b65bd;
  piVar8 = __errno_location();
  if (*piVar8 == 4) goto LAB_001b659a;
LAB_001b65c2:
  if (0 < (int)uVar9) {
    pppppplVar1[0x20] = (long *****)((long)pppppplVar1[0x20] + (ulong)(uVar9 & 0x7fffffff));
    goto LAB_001b659a;
  }
  if (uVar9 != 0) {
    pcStack_b0 = (code *)0x1b65dc;
    piVar8 = __errno_location();
    if ((*piVar8 == 0xb) || (*piVar8 == 0x73)) goto switchD_001b640c_caseD_4;
    pcStack_b0 = (code *)0x1b65f5;
    connection_poll_cb_cold_3();
  }
LAB_001b65f5:
  *(undefined4 *)(pppppplVar1 + 0x23) = 1;
  uVar11 = uVar11 & 0xfffffffe;
  goto switchD_001b640c_caseD_4;
}

Assistant:

static void server_poll_cb(uv_poll_t* handle, int status, int events) {
  server_context_t* server_context = (server_context_t*)
                                          handle->data;
  connection_context_t* connection_context;
  struct sockaddr_in addr;
  socklen_t addr_len;
  uv_os_sock_t sock;
  int r;

  addr_len = sizeof addr;
  sock = accept(server_context->sock, (struct sockaddr*) &addr, &addr_len);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

  connection_context = create_connection_context(sock, 1);
  connection_context->events = UV_READABLE | UV_WRITABLE | UV_DISCONNECT;
  r = uv_poll_start(&connection_context->poll_handle,
                    UV_READABLE | UV_WRITABLE | UV_DISCONNECT,
                    connection_poll_cb);
  ASSERT_OK(r);

  if (++server_context->connections == NUM_CLIENTS) {
    close_socket(server_context->sock);
    destroy_server_context(server_context);
  }
}